

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_predictive_encoder.h
# Opt level: O0

void __thiscall
draco::MeshEdgebreakerTraversalPredictiveEncoder::EncodeSymbol
          (MeshEdgebreakerTraversalPredictiveEncoder *this,EdgebreakerTopologyBitPattern symbol)

{
  bool bVar1;
  uint uVar2;
  vector<bool,_std::allocator<bool>_> *this_00;
  reference pvVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  vector<int,_std::allocator<int>_> *this_01;
  CornerTable *this_02;
  uint in_ESI;
  long in_RDI;
  bool store_prev_symbol;
  CornerIndex prev;
  CornerIndex next;
  int32_t predicted_symbol;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffef8;
  MeshEdgebreakerTraversalEncoder *in_stack_ffffffffffffff00;
  MeshEdgebreakerTraversalPredictiveEncoder *in_stack_ffffffffffffff08;
  CornerIndex in_stack_ffffffffffffff10;
  CornerIndex corner;
  bool __x;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_8c;
  uint local_88;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_84;
  undefined4 local_80;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_7c;
  uint local_78;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_74;
  uint local_70;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_6c;
  undefined4 local_68;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_64;
  uint local_60;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_5c;
  uint local_58;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_54;
  undefined4 local_50;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_4c;
  uint local_48;
  uint local_44;
  undefined4 local_40;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_3c;
  uint local_38;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_34;
  uint local_30;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_2c;
  uint local_28;
  uint local_24;
  undefined4 local_20;
  uint local_1c;
  undefined4 local_18;
  uint local_14;
  int32_t local_10;
  uint local_c;
  
  *(int *)(in_RDI + 0xec) = *(int *)(in_RDI + 0xec) + 1;
  local_10 = -1;
  local_18 = *(undefined4 *)(in_RDI + 0xe8);
  local_c = in_ESI;
  local_14 = (uint)CornerTable::Next((CornerTable *)in_stack_ffffffffffffff08,
                                     in_stack_ffffffffffffff10);
  local_20 = *(undefined4 *)(in_RDI + 0xe8);
  local_1c = (uint)CornerTable::Previous
                             ((CornerTable *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
  this_00 = (vector<bool,_std::allocator<bool>_> *)(ulong)local_c;
  switch(this_00) {
  case (vector<bool,_std::allocator<bool>_> *)0x0:
    local_28 = local_14;
    local_24 = (uint)CornerTable::Vertex((CornerTable *)in_stack_ffffffffffffff08,
                                         in_stack_ffffffffffffff10);
    local_10 = ComputePredictedSymbol
                         (in_stack_ffffffffffffff08,(VertexIndex)in_stack_ffffffffffffff10.value_);
  case (vector<bool,_std::allocator<bool>_> *)0x1:
    pvVar4 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0xa0);
    local_30 = local_14;
    local_2c.value_ =
         (uint)CornerTable::Vertex((CornerTable *)in_stack_ffffffffffffff08,
                                   in_stack_ffffffffffffff10);
    uVar2 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_2c);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(ulong)uVar2);
    *pvVar3 = *pvVar3 + -1;
    pvVar4 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0xa0);
    local_38 = local_1c;
    local_34.value_ =
         (uint)CornerTable::Vertex((CornerTable *)in_stack_ffffffffffffff08,
                                   in_stack_ffffffffffffff10);
    uVar2 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_34);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(ulong)uVar2);
    *pvVar3 = *pvVar3 + -1;
    if (local_c == 1) {
      pvVar4 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0xa0);
      local_40 = *(undefined4 *)(in_RDI + 0xe8);
      local_3c.value_ =
           (uint)CornerTable::Vertex((CornerTable *)in_stack_ffffffffffffff08,
                                     in_stack_ffffffffffffff10);
      uVar2 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_3c);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(ulong)uVar2);
      *pvVar3 = -1;
      *(int *)(in_RDI + 0xe4) = *(int *)(in_RDI + 0xe4) + 1;
    }
    break;
  default:
    break;
  case (vector<bool,_std::allocator<bool>_> *)0x3:
    pvVar4 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0xa0);
    local_68 = *(undefined4 *)(in_RDI + 0xe8);
    local_64.value_ =
         (uint)CornerTable::Vertex((CornerTable *)in_stack_ffffffffffffff08,(uint)pvVar4);
    uVar2 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_64);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(ulong)uVar2);
    *pvVar3 = *pvVar3 + -1;
    this_01 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0xa0);
    local_70 = local_14;
    corner.value_ = (uint)pvVar4;
    local_6c.value_ = (uint)CornerTable::Vertex((CornerTable *)in_stack_ffffffffffffff08,corner);
    uVar2 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_6c);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(ulong)uVar2);
    *pvVar3 = *pvVar3 + -2;
    pvVar4 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0xa0);
    local_78 = local_1c;
    local_74.value_ = (uint)CornerTable::Vertex((CornerTable *)in_stack_ffffffffffffff08,corner);
    uVar2 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_74);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(ulong)uVar2);
    *pvVar3 = *pvVar3 + -1;
    break;
  case (vector<bool,_std::allocator<bool>_> *)0x5:
    local_48 = local_14;
    local_44 = (uint)CornerTable::Vertex((CornerTable *)in_stack_ffffffffffffff08,
                                         in_stack_ffffffffffffff10);
    local_10 = ComputePredictedSymbol
                         (in_stack_ffffffffffffff08,(VertexIndex)in_stack_ffffffffffffff10.value_);
    pvVar4 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0xa0);
    local_50 = *(undefined4 *)(in_RDI + 0xe8);
    local_4c.value_ =
         (uint)CornerTable::Vertex((CornerTable *)in_stack_ffffffffffffff08,
                                   in_stack_ffffffffffffff10);
    uVar2 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_4c);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(ulong)uVar2);
    *pvVar3 = *pvVar3 + -1;
    pvVar4 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0xa0);
    local_58 = local_14;
    local_54.value_ =
         (uint)CornerTable::Vertex((CornerTable *)in_stack_ffffffffffffff08,
                                   in_stack_ffffffffffffff10);
    uVar2 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_54);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(ulong)uVar2);
    *pvVar3 = *pvVar3 + -1;
    pvVar4 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0xa0);
    local_60 = local_1c;
    local_5c.value_ =
         (uint)CornerTable::Vertex((CornerTable *)in_stack_ffffffffffffff08,
                                   in_stack_ffffffffffffff10);
    uVar2 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_5c);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(ulong)uVar2);
    *pvVar3 = *pvVar3 + -2;
    break;
  case (vector<bool,_std::allocator<bool>_> *)0x7:
    in_stack_fffffffffffffef8 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0xa0);
    local_80 = *(undefined4 *)(in_RDI + 0xe8);
    local_7c.value_ =
         (uint)CornerTable::Vertex((CornerTable *)in_stack_ffffffffffffff08,
                                   in_stack_ffffffffffffff10);
    uVar2 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_7c);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       (in_stack_fffffffffffffef8,(ulong)uVar2);
    *pvVar3 = *pvVar3 + -2;
    in_stack_ffffffffffffff00 = (MeshEdgebreakerTraversalEncoder *)(in_RDI + 0xa0);
    local_88 = local_14;
    local_84.value_ =
         (uint)CornerTable::Vertex((CornerTable *)in_stack_ffffffffffffff08,
                                   in_stack_ffffffffffffff10);
    uVar2 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_84);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff00,(ulong)uVar2)
    ;
    *pvVar3 = *pvVar3 + -2;
    this_02 = (CornerTable *)(in_RDI + 0xa0);
    local_8c.value_ = (uint)CornerTable::Vertex(this_02,in_stack_ffffffffffffff10);
    uVar2 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_8c);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)this_02,(ulong)uVar2);
    *pvVar3 = *pvVar3 + -2;
  }
  bVar1 = true;
  if (local_10 != -1) {
    __x = SUB81((ulong)in_RDI >> 0x38,0);
    if (local_10 == *(int *)(in_RDI + 0xe0)) {
      std::vector<bool,_std::allocator<bool>_>::push_back(this_00,__x);
      bVar1 = false;
    }
    else if (*(int *)(in_RDI + 0xe0) != -1) {
      std::vector<bool,_std::allocator<bool>_>::push_back(this_00,__x);
    }
  }
  if ((bVar1) && (*(int *)(in_RDI + 0xe0) != -1)) {
    MeshEdgebreakerTraversalEncoder::EncodeSymbol
              (in_stack_ffffffffffffff00,
               (EdgebreakerTopologyBitPattern)((ulong)in_stack_fffffffffffffef8 >> 0x20));
  }
  *(uint *)(in_RDI + 0xe0) = local_c;
  return;
}

Assistant:

inline void EncodeSymbol(EdgebreakerTopologyBitPattern symbol) {
    ++num_symbols_;
    // Update valences on the mesh. And compute the predicted preceding symbol.
    // Note that the valences are computed for the so far unencoded part of the
    // mesh. Adding a new symbol either reduces valences on the vertices or
    // leaves the valence unchanged.
    int32_t predicted_symbol = -1;
    const CornerIndex next = corner_table_->Next(last_corner_);
    const CornerIndex prev = corner_table_->Previous(last_corner_);
    switch (symbol) {
      case TOPOLOGY_C:
        // Compute prediction.
        predicted_symbol = ComputePredictedSymbol(corner_table_->Vertex(next));
        FALLTHROUGH_INTENDED;
      case TOPOLOGY_S:
        // Update valences.
        vertex_valences_[corner_table_->Vertex(next).value()] -= 1;
        vertex_valences_[corner_table_->Vertex(prev).value()] -= 1;
        if (symbol == TOPOLOGY_S) {
          // Whenever we reach a split symbol, mark its tip vertex as invalid by
          // setting the valence to a negative value. Any prediction that will
          // use this vertex will then cause a misprediction. This is currently
          // necessary because the decoding works in the reverse direction and
          // the decoder doesn't know about these vertices until the split
          // symbol is decoded at which point two vertices are merged into one.
          // This can be most likely solved on the encoder side by splitting the
          // tip vertex into two, but since split symbols are relatively rare,
          // it's probably not worth doing it.
          vertex_valences_[corner_table_->Vertex(last_corner_).value()] = -1;
          ++num_split_symbols_;
        }
        break;
      case TOPOLOGY_R:
        // Compute prediction.
        predicted_symbol = ComputePredictedSymbol(corner_table_->Vertex(next));
        // Update valences.
        vertex_valences_[corner_table_->Vertex(last_corner_).value()] -= 1;
        vertex_valences_[corner_table_->Vertex(next).value()] -= 1;
        vertex_valences_[corner_table_->Vertex(prev).value()] -= 2;
        break;
      case TOPOLOGY_L:
        vertex_valences_[corner_table_->Vertex(last_corner_).value()] -= 1;
        vertex_valences_[corner_table_->Vertex(next).value()] -= 2;
        vertex_valences_[corner_table_->Vertex(prev).value()] -= 1;
        break;
      case TOPOLOGY_E:
        vertex_valences_[corner_table_->Vertex(last_corner_).value()] -= 2;
        vertex_valences_[corner_table_->Vertex(next).value()] -= 2;
        vertex_valences_[corner_table_->Vertex(prev).value()] -= 2;
        break;
      default:
        break;
    }
    // Flag used when it's necessary to explicitly store the previous symbol.
    bool store_prev_symbol = true;
    if (predicted_symbol != -1) {
      if (predicted_symbol == prev_symbol_) {
        predictions_.push_back(true);
        store_prev_symbol = false;
      } else if (prev_symbol_ != -1) {
        predictions_.push_back(false);
      }
    }
    if (store_prev_symbol && prev_symbol_ != -1) {
      MeshEdgebreakerTraversalEncoder::EncodeSymbol(
          static_cast<EdgebreakerTopologyBitPattern>(prev_symbol_));
    }
    prev_symbol_ = symbol;
  }